

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_embed_optimize_for.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestEmbedOptimizedForSize::_InternalSerialize
          (TestEmbedOptimizedForSize *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  TestOptimizedForSize *value;
  ulong uVar2;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestOptimizedForSize>_>
  *value_00;
  uint8_t *puVar3;
  int index;
  
  if ((undefined1  [40])((undefined1  [40])this->field_0 & (undefined1  [40])0x1) !=
      (undefined1  [40])0x0) {
    value = (this->field_0)._impl_.optional_message_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  if (iVar1 != 0) {
    index = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestOptimizedForSize>>
                           (&(this->field_0)._impl_.repeated_message_.super_RepeatedPtrFieldBase,
                            index);
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (2,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestEmbedOptimizedForSize::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestEmbedOptimizedForSize& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestEmbedOptimizedForSize)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .proto2_unittest.TestOptimizedForSize optional_message = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.optional_message_, this_._impl_.optional_message_->GetCachedSize(), target,
        stream);
  }

  // repeated .proto2_unittest.TestOptimizedForSize repeated_message = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_message_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_message().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestEmbedOptimizedForSize)
  return target;
}